

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall
Lodtalk::StackInterpreterProxy::sendMessage(StackInterpreterProxy *this,int argumentCount)

{
  StackInterpreter *this_00;
  StackMemory *pSVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 selector;
  
  this_00 = this->interpreter;
  pSVar1 = this_00->stack;
  paVar2 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(pSVar1->stackFrame).stackPointer;
  selector = *paVar2;
  (pSVar1->stackFrame).stackPointer = (uint8_t *)(paVar2 + 1);
  StackInterpreter::sendSelectorArgumentCount(this_00,(Oop)selector,(long)argumentCount,false);
  StackInterpreter::interpret(this->interpreter);
  return;
}

Assistant:

void StackInterpreterProxy::sendMessage(int argumentCount)
{
    interpreter->sendMessage(argumentCount);
    interpreter->interpret();
}